

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

CoverCrossSyntax * __thiscall
slang::parsing::Parser::parseCoverCross(Parser *this,AttrList attributes,NamedLabelSyntax *label)

{
  SyntaxFactory *this_00;
  SyntaxNode *pSVar1;
  Token openBrace;
  Token openBrace_00;
  Token closeBrace_00;
  Token emptySemi;
  Info *pIVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  IdentifierNameSyntax *pIVar9;
  SourceLocation SVar10;
  CoverageIffClauseSyntax *iff;
  Diagnostic *this_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  CoverCrossSyntax *pCVar11;
  __extent_storage<18446744073709551615UL> _Var12;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX;
  EVP_PKEY_CTX *src_00;
  SmallVector<slang::syntax::MemberSyntax_*,_8UL> *attributes_00;
  BumpAllocator *dst;
  byte bVar13;
  bool bVar14;
  Token cross;
  Token TVar15;
  SourceRange range;
  string_view arg;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> local_268;
  MemberSyntax *member;
  SyntaxKind local_228;
  SyntaxNode *local_220;
  SyntaxNode *pSStack_218;
  size_t local_210;
  pointer ppMStack_208;
  __extent_storage<18446744073709551615UL> local_200;
  CoverageIffClauseSyntax *local_1f8;
  Info *local_1f0;
  undefined8 local_1e8;
  Token *local_1e0;
  Token *local_1d8;
  Token closeBrace;
  SmallVector<slang::syntax::MemberSyntax_*,_8UL> members;
  Token local_138;
  Token local_128;
  Token local_118;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  
  _Var12 = attributes._M_extent._M_extent_value;
  cross = ParserBase::expect(&this->super_ParserBase,CrossKeyword);
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
       (pointer)buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 8;
  this_00 = &this->factory;
  while( true ) {
    TVar15 = ParserBase::expect(&this->super_ParserBase,Identifier);
    pIVar9 = slang::syntax::SyntaxFactory::identifierName(this_00,TVar15);
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ = (pointer)pIVar9;
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap =
         CONCAT71(members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap._1_7_,1);
    SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
              (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,(TokenOrSyntax *)&members
              );
    bVar5 = ParserBase::peek(&this->super_ParserBase,Comma);
    if (!bVar5) break;
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>._0_16_ =
         ParserBase::consume(&this->super_ParserBase);
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap =
         members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap & 0xffffffffffffff00;
    SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
              (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,(TokenOrSyntax *)&members
              );
  }
  if (buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len < 2) {
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>._0_16_ =
         ParserBase::peek(&this->super_ParserBase);
    SVar10 = Token::location((Token *)&members);
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x120005,SVar10);
  }
  iff = parseCoverageIffClause(this);
  bVar5 = ParserBase::peek(&this->super_ParserBase,OpenBrace);
  members.stackBase._0_8_ = _Var12._M_extent_value;
  members.stackBase._8_8_ = attributes._M_ptr;
  members.stackBase._16_8_ = _Var12._M_extent_value;
  if (bVar5) {
    TVar15 = ParserBase::consume(&this->super_ParserBase);
    local_1f0 = TVar15.info;
    local_1e8 = TVar15._0_8_;
    local_1f8 = iff;
    Token::Token(&closeBrace);
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len = 0;
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
         (pointer)members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement;
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap = 8;
    local_1d8 = &(this->super_ParserBase).lastPoppedDelims.first;
    local_1e0 = &(this->super_ParserBase).lastPoppedDelims.second;
    bVar5 = false;
    while( true ) {
      TVar15 = ParserBase::peek(&this->super_ParserBase);
      if ((TVar15.kind == EndOfFile) || ((TVar15._0_4_ & 0xffff) == 0xe)) break;
      member = parseCoverCrossMember(this);
      bVar14 = member == (MemberSyntax *)0x0;
      if (bVar14) {
        bVar6 = slang::syntax::SyntaxFacts::isCloseDelimOrKeyword(TVar15.kind);
        if (bVar6) {
          local_268.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
          range = Token::range((Token *)&local_268);
          this_01 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xb80005,range);
          local_268.super_SyntaxListBase._0_16_ = ParserBase::peek(&this->super_ParserBase);
          arg = Token::valueText((Token *)&local_268);
          Diagnostic::operator<<(this_01,arg);
          bVar13 = 0;
          if (((this->super_ParserBase).lastPoppedDelims.first.info != (Info *)0x0) &&
             (bVar13 = 0, (this->super_ParserBase).lastPoppedDelims.second.info != (Info *)0x0)) {
            SVar10 = Token::location(local_1d8);
            Diagnostic::addNote(this_01,(DiagCode)0xc10005,SVar10);
            SVar10 = Token::location(local_1e0);
            Diagnostic::addNote(this_01,(DiagCode)0xc00005,SVar10);
            bVar13 = 0;
          }
        }
        else {
          bVar13 = ~bVar5 & 1;
        }
        ParserBase::skipToken
                  (&this->super_ParserBase,
                   (optional<slang::DiagCode>)((uint6)bVar13 << 0x20 | 0x450005));
        bVar5 = bVar14;
      }
      else {
        SmallVectorBase<slang::syntax::MemberSyntax*>::
        emplace_back<slang::syntax::MemberSyntax*const&>
                  ((SmallVectorBase<slang::syntax::MemberSyntax*> *)&members,&member);
        pSVar1 = this->previewNode;
        this->previewNode = (SyntaxNode *)0x0;
        (member->super_SyntaxNode).previewNode = pSVar1;
        bVar5 = bVar14;
      }
    }
    closeBrace = ParserBase::expect(&this->super_ParserBase,CloseBrace);
    dst = (this->super_ParserBase).alloc;
    iVar7 = SmallVectorBase<slang::syntax::MemberSyntax_*>::copy
                      (&members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>,
                       (EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)closeBrace.info);
    SmallVectorBase<slang::syntax::MemberSyntax_*>::cleanup
              (&members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>,(EVP_PKEY_CTX *)dst);
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len._0_4_ = 1;
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap = 0;
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[0] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[1] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[2] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[3] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[4] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[5] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[6] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[7] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
         (pointer)&PTR_getChild_0057dcc8;
    iVar8 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                      (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                       (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src_00);
    TVar15 = closeBrace;
    uVar3 = local_1e8;
    pIVar2 = local_1f0;
    local_268.elements._M_ptr = (pointer)CONCAT44(extraout_var_01,iVar8);
    local_268.super_SyntaxListBase.super_SyntaxNode.kind = 3;
    local_268.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
    local_268.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
    local_268.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0057e530;
    local_228 = SyntaxList;
    local_220 = (SyntaxNode *)0x0;
    pSStack_218 = (SyntaxNode *)0x0;
    member = (MemberSyntax *)&PTR_getChild_0057dd50;
    local_210 = extraout_RDX;
    ppMStack_208 = (pointer)CONCAT44(extraout_var_00,iVar7);
    local_200._M_extent_value = extraout_RDX;
    Token::Token(&local_118);
    uVar4 = local_1e8;
    attributes_00 = &members;
    openBrace_00.info = pIVar2;
    local_1e8._0_2_ = (undefined2)uVar3;
    local_1e8._2_1_ = SUB81(uVar3,2);
    local_1e8._3_1_ = SUB81(uVar3,3);
    local_1e8._4_4_ = SUB84(uVar3,4);
    openBrace_00.kind = (undefined2)local_1e8;
    openBrace_00._2_1_ = local_1e8._2_1_;
    openBrace_00.numFlags.raw = local_1e8._3_1_;
    openBrace_00.rawLen = local_1e8._4_4_;
    emptySemi.info = local_118.info;
    emptySemi.kind = local_118.kind;
    emptySemi._2_1_ = local_118._2_1_;
    emptySemi.numFlags.raw = local_118.numFlags.raw;
    emptySemi.rawLen = local_118.rawLen;
    local_1e8 = uVar4;
    pCVar11 = slang::syntax::SyntaxFactory::coverCross
                        (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)attributes_00
                         ,label,cross,&local_268,local_1f8,openBrace_00,
                         (SyntaxList<slang::syntax::MemberSyntax> *)&member,TVar15,emptySemi);
  }
  else {
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.len._0_4_ = 1;
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.cap = 0;
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[0] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[1] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[2] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[3] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[4] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[5] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[6] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.firstElement[7] = '\0';
    members.super_SmallVectorBase<slang::syntax::MemberSyntax_*>.data_ =
         (pointer)&PTR_getChild_0057dcc8;
    iVar7 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                      (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                       (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
    local_268.elements._M_ptr = (pointer)CONCAT44(extraout_var,iVar7);
    local_268.super_SyntaxListBase.super_SyntaxNode.kind = 3;
    local_268.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
    local_268.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
    local_268.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0057e530;
    Token::Token(&local_128);
    local_228 = SyntaxList;
    local_200._M_extent_value = 0;
    local_220 = (SyntaxNode *)0x0;
    pSStack_218 = (SyntaxNode *)0x0;
    local_210 = 0;
    ppMStack_208 = (pointer)0x0;
    member = (MemberSyntax *)&PTR_getChild_0057dd50;
    Token::Token(&local_138);
    TVar15 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    attributes_00 = &members;
    openBrace.info = local_128.info;
    openBrace.kind = local_128.kind;
    openBrace._2_1_ = local_128._2_1_;
    openBrace.numFlags.raw = local_128.numFlags.raw;
    openBrace.rawLen = local_128.rawLen;
    closeBrace_00.info = local_138.info;
    closeBrace_00.kind = local_138.kind;
    closeBrace_00._2_1_ = local_138._2_1_;
    closeBrace_00.numFlags.raw = local_138.numFlags.raw;
    closeBrace_00.rawLen = local_138.rawLen;
    pCVar11 = slang::syntax::SyntaxFactory::coverCross
                        (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)attributes_00
                         ,label,cross,&local_268,iff,openBrace,
                         (SyntaxList<slang::syntax::MemberSyntax> *)&member,closeBrace_00,TVar15);
  }
  SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
            (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
             (EVP_PKEY_CTX *)attributes_00);
  return pCVar11;
}

Assistant:

CoverCrossSyntax* Parser::parseCoverCross(AttrList attributes, NamedLabelSyntax* label) {
    auto keyword = expect(TokenKind::CrossKeyword);

    SmallVector<TokenOrSyntax, 8> buffer;
    while (true) {
        auto name = expect(TokenKind::Identifier);
        buffer.push_back(&factory.identifierName(name));
        if (!peek(TokenKind::Comma))
            break;

        buffer.push_back(consume());
    }

    if (buffer.size() < 2)
        addDiag(diag::CoverCrossItems, peek().location());

    auto iff = parseCoverageIffClause();

    if (peek(TokenKind::OpenBrace)) {
        auto openBrace = consume();

        Token closeBrace;
        auto members = parseMemberList<MemberSyntax>(
            TokenKind::CloseBrace, closeBrace, SyntaxKind::CoverCross,
            [this](SyntaxKind, bool&) { return parseCoverCrossMember(); });

        return &factory.coverCross(attributes, label, keyword, buffer.copy(alloc), iff, openBrace,
                                   members, closeBrace, Token());
    }

    // no brace, so this is an empty list, expect a semicolon
    return &factory.coverCross(attributes, label, keyword, buffer.copy(alloc), iff, Token(),
                               nullptr, Token(), expect(TokenKind::Semicolon));
}